

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::reduceDB_Tier2(Solver *this)

{
  uint64_t *puVar1;
  ulong *puVar2;
  double dVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  lbool *plVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  float fVar18;
  
  reset_old_trail(this);
  sort<unsigned_int,reduceDB_tch>
            ((this->learnts_tier2).data,(this->learnts_tier2).sz,(reduceDB_tch)&this->ca);
  uVar8 = (this->learnts_tier2).sz;
  if (0 < (int)uVar8) {
    uVar7 = uVar8 >> 1;
    lVar16 = 0;
    iVar17 = 0;
    do {
      puVar5 = (this->learnts_tier2).data;
      uVar8 = puVar5[lVar16];
      puVar6 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      uVar9 = *(ulong *)(puVar6 + uVar8);
      if (((uint)uVar9 & 3) == 2) {
        puVar2 = (ulong *)(puVar6 + uVar8);
        if ((uVar9 & 0xfffffffc00000000) == 0x800000000) {
          plVar11 = (this->assigns).data;
          uVar9 = (ulong)(plVar11[(int)puVar2[1] >> 1].value != ((byte)(int)puVar2[1] & 1));
        }
        else {
          plVar11 = (this->assigns).data;
          uVar9 = 0;
        }
        iVar15 = *(int *)((long)puVar2 + uVar9 * 4 + 8);
        iVar12 = iVar15 >> 1;
        bVar14 = true;
        if (plVar11[iVar12].value == ((byte)iVar15 & 1)) {
          uVar4 = (this->vardata).data[iVar12].reason;
          bVar14 = uVar4 != uVar8 || uVar4 == 0xffffffff;
        }
        if ((bVar14) && (lVar16 < (int)uVar7)) {
          vec<unsigned_int>::push(&this->learnts_local,puVar5 + lVar16);
          uVar9 = *puVar2;
          *puVar2 = uVar9 & 0xfffffffffffffffc;
          uVar9 = uVar9 >> 0x22;
          *(int *)((long)puVar2 + uVar9 * 4 + 0xc) = (int)this->conflicts;
          dVar3 = this->cla_inc;
          fVar18 = (float)(dVar3 + 0.0);
          *(float *)((long)puVar2 + uVar9 * 4 + 8) = fVar18;
          if (1e+20 < fVar18) {
            lVar10 = (long)(this->learnts_local).sz;
            if (0 < lVar10) {
              puVar5 = (this->learnts_local).data;
              puVar6 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
              lVar13 = 0;
              do {
                puVar2 = (ulong *)(puVar6 + puVar5[lVar13]);
                *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) =
                     *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) * 1e-20;
                lVar13 = lVar13 + 1;
              } while (lVar10 != lVar13);
            }
            this->cla_inc = dVar3 * 1e-20;
          }
        }
        else {
          puVar5[iVar17] = uVar8;
          if ((*puVar2 & 0xfffffffc00000000) == 0x800000000) {
            iVar15 = (int)puVar2[1];
            uVar9 = (ulong)(plVar11[iVar15 >> 1].value != ((byte)iVar15 & 1));
          }
          else {
            uVar9 = 0;
          }
          iVar17 = iVar17 + 1;
          iVar15 = *(int *)((long)(puVar2 + 1) + uVar9 * 4);
          iVar12 = iVar15 >> 1;
          if ((plVar11[iVar12].value == ((byte)iVar15 & 1)) &&
             (uVar4 = (this->vardata).data[iVar12].reason, uVar4 != 0xffffffff)) {
            uVar7 = uVar7 + (uVar4 == uVar8);
          }
        }
      }
      lVar16 = lVar16 + 1;
      uVar8 = (this->learnts_tier2).sz;
    } while (lVar16 < (int)uVar8);
    iVar15 = (int)lVar16 - iVar17;
    if (iVar15 != 0 && iVar17 <= (int)lVar16) {
      uVar8 = uVar8 - iVar15;
      (this->learnts_tier2).sz = uVar8;
    }
  }
  puVar1 = &(this->statistics).solveSteps;
  *puVar1 = *puVar1 + (long)(int)uVar8;
  return;
}

Assistant:

void Solver::reduceDB_Tier2()
{
    TRACE(std::cout << "c run reduceDB_tier2 on level " << decisionLevel() << std::endl);
    reset_old_trail();
    int i, j;
    sort(learnts_tier2, reduceDB_tch(ca));
    int limit = learnts_tier2.size() / 2;

    for (i = j = 0; i < learnts_tier2.size(); i++) {
        Clause &c = ca[learnts_tier2[i]];
        if (c.mark() == TIER2) {
            if (!locked(c) && i < limit) {
                learnts_local.push(learnts_tier2[i]);
                c.mark(LOCAL);
                // c.removable(true);
                c.activity() = 0;
                c.touched() = conflicts;
                claBumpActivity(c);
            } else {
                learnts_tier2[j++] = learnts_tier2[i];
                if (locked(c)) {
                    limit++;
                }
            }
        }
    }
    learnts_tier2.shrink(i - j);
    statistics.solveSteps += learnts_tier2.size();
    TRACE(std::cout << "c done running reduceDB_tier2 on level " << decisionLevel() << std::endl);
}